

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O1

void __thiscall
bgui::FileImageWindow::FileImageWindow
          (FileImageWindow *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,int firstfile,bool watch,int x,int y,int w,int h,bool size_max,double init_scale,
          double init_min,double init_max,double valid_min,double valid_max,keep k,mapping m,int c,
          char *viewcmd)

{
  char *pcVar1;
  char *__s;
  IOException *this_00;
  bool size_max_00;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  ImageWindow::ImageWindow(&this->super_ImageWindow);
  (this->super_ImageWindow).super_BaseWindow._vptr_BaseWindow =
       (_func_int **)&PTR__FileImageWindow_00121a00;
  (this->vc)._M_dataplus._M_p = (pointer)&(this->vc).field_2;
  (this->vc)._M_string_length = 0;
  (this->vc).field_2._M_local_buf[0] = '\0';
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((files->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (files->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (IOException *)__cxa_allocate_exception(0x28);
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"The list of files must not be empty","");
    gutil::IOException::IOException(this_00,local_1a8);
    __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Files:\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"<cursor left>  Load previous image\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"<cursor right> Load next image\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\'u\'            Reload current image and toggle watching the current image for changes\n"
             ,0x56);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\'k\'            Switch between keep, keep_all and not keeping the settings when (re)loading\n"
             ,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\'c\'            Capture current content of the window and store it next to the original image\n"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\'d\'            Rename current image by adding the suffix .bak and remove it from the list\n"
             ,0x5a);
  __s = viewcmd;
  if (viewcmd != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"3D Visualization:\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "\'p\'            Open part of disparity image (with parameter file) in plyv\n",0x4a)
    ;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  ImageWindow::addHelpText(&this->super_ImageWindow,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if (__s != (char *)0x0) {
    pcVar1 = (char *)(this->vc)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&this->vc,0,pcVar1,(ulong)__s);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->list,files);
  this->current = firstfile;
  this->scale = init_scale;
  this->imin = init_min;
  this->imax = init_max;
  this->vmin = valid_min;
  this->vmax = valid_max;
  this->kp = k;
  this->map = m;
  this->channel = c;
  this->watch_file = watch;
  this->wid = -1;
  if ((w < 1) || (size_max_00 = size_max, h < 1)) {
    BaseWindow::getDisplaySize((BaseWindow *)this,&w,&h);
    size_max_00 = true;
  }
  load(this,&this->current,true,w,h,size_max_00);
  BaseWindow::setVisible((BaseWindow *)this,true);
  if (-1 < (y | x)) {
    BaseWindow::setPosition((BaseWindow *)this,x,y);
  }
  return;
}

Assistant:

FileImageWindow::FileImageWindow(const std::vector<std::string> &files, int firstfile,
                                 bool watch, int x, int y, int w, int h, bool size_max, double init_scale,
                                 double init_min, double init_max, double valid_min, double valid_max, keep k,
                                 mapping m, int c, const char *viewcmd)
{
  if (files.empty())
  {
    throw gutil::IOException("The list of files must not be empty");
  }

  addHelpText(createHelpText(viewcmd != 0));

  if (viewcmd != 0)
  {
    vc=viewcmd;
  }

  list=files;
  current=firstfile;

  scale=init_scale;
  imin=init_min;
  imax=init_max;
  vmin=valid_min;
  vmax=valid_max;
  kp=k;
  map=m;
  channel=c;
  watch_file=watch;
  wid=-1;

  if (w <= 0 || h <= 0)
  {
    getDisplaySize(w, h);
    size_max=true;
  }

  load(current, true, w, h, size_max);

  setVisible(true);

  if (x >= 0 && y >= 0)
  {
    setPosition(x, y);
  }
}